

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O0

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  uint64_t *puVar1;
  ArgListType *pAVar2;
  Expression *pEVar3;
  Block *pBVar4;
  Block *pBVar5;
  pool_ref<soul::heart::Expression> local_80;
  pool_ref<soul::heart::Expression> *local_78;
  pool_ref<soul::heart::Expression> *arg_1;
  pool_ref<soul::heart::Expression> *__end2_1;
  pool_ref<soul::heart::Expression> *__begin2_1;
  ArgListType *__range2_1;
  pool_ref<soul::heart::Expression> local_48;
  pool_ref<soul::heart::Expression> *local_40;
  pool_ref<soul::heart::Expression> *arg;
  pool_ref<soul::heart::Expression> *__end2;
  pool_ref<soul::heart::Expression> *__begin2;
  ArgListType *__range2;
  BranchIf *b;
  BranchIf *old_local;
  ModuleCloner *this_local;
  
  this_00 = this->newModule;
  b = (BranchIf *)__fn;
  old_local = (BranchIf *)this;
  pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)(__fn + 0x18));
  pEVar3 = cloneExpression(this,pEVar3);
  pBVar4 = pool_ref::operator_cast_to_Block_((pool_ref *)b->targets);
  pBVar4 = getRemappedBlock(this,pBVar4);
  pBVar5 = pool_ref::operator_cast_to_Block_((pool_ref *)(b->targets + 1));
  pBVar5 = getRemappedBlock(this,pBVar5);
  __range2 = (ArgListType *)
             Module::
             allocate<soul::heart::BranchIf,soul::heart::Expression&,soul::heart::Block&,soul::heart::Block&>
                       (this_00,pEVar3,pBVar4,pBVar5);
  __begin2 = (pool_ref<soul::heart::Expression> *)b->targetArgs;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                      __begin2);
  arg = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::end
                  ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)__begin2)
  ;
  for (; __end2 != arg; __end2 = __end2 + 1) {
    local_40 = __end2;
    puVar1 = __range2->space;
    pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)__end2);
    pEVar3 = cloneExpression(this,pEVar3);
    pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>(&local_48,pEVar3);
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)(puVar1 + 3),
               &local_48);
    pool_ref<soul::heart::Expression>::~pool_ref(&local_48);
  }
  __begin2_1 = (pool_ref<soul::heart::Expression> *)(b->targetArgs + 1);
  __end2_1 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::begin
                       ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                        __begin2_1);
  arg_1 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::end
                    ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                     __begin2_1);
  for (; __end2_1 != arg_1; __end2_1 = __end2_1 + 1) {
    local_78 = __end2_1;
    pAVar2 = __range2 + 1;
    pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)__end2_1);
    pEVar3 = cloneExpression(this,pEVar3);
    pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>(&local_80,pEVar3);
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
               (pAVar2->space + 3),&local_80);
    pool_ref<soul::heart::Expression>::~pool_ref(&local_80);
  }
  return (int)__range2;
}

Assistant:

heart::BranchIf& clone (const heart::BranchIf& old)
    {
        auto& b =  newModule.allocate<heart::BranchIf> (cloneExpression (old.condition),
                                                        getRemappedBlock (old.targets[0]),
                                                        getRemappedBlock (old.targets[1]));

        for (auto& arg : old.targetArgs[0])
            b.targetArgs[0].push_back (cloneExpression (arg));

        for (auto& arg : old.targetArgs[1])
            b.targetArgs[1].push_back (cloneExpression (arg));

        return b;
    }